

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,slang::syntax::TokenList_const&>
          (BumpAllocator *this,TokenList *args)

{
  MacroActualArgumentSyntax *this_00;
  
  this_00 = (MacroActualArgumentSyntax *)allocate(this,0x40,8);
  slang::syntax::MacroActualArgumentSyntax::MacroActualArgumentSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }